

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenArrayFillSetSize(BinaryenExpressionRef expr,BinaryenExpressionRef sizeExpr)

{
  if (expr->_id != ArrayFillId) {
    __assert_fail("expression->is<ArrayFill>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x11ad,
                  "void BinaryenArrayFillSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sizeExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)sizeExpr;
    return;
  }
  __assert_fail("sizeExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x11ae,
                "void BinaryenArrayFillSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayFillSetSize(BinaryenExpressionRef expr,
                              BinaryenExpressionRef sizeExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayFill>());
  assert(sizeExpr);
  static_cast<ArrayFill*>(expression)->size = (Expression*)sizeExpr;
}